

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.h
# Opt level: O0

char * __thiscall
Jinx::StaticArena<8192ul,16ul>::allocate<4ul>(StaticArena<8192ul,16ul> *this,size_t n)

{
  bool bVar1;
  StaticArena<8192ul,16ul> *pSVar2;
  char *r;
  size_t aligned_n;
  size_t n_local;
  StaticArena<8192UL,_16UL> *this_local;
  
  bVar1 = StaticArena<8192UL,_16UL>::pointer_in_buffer
                    ((StaticArena<8192UL,_16UL> *)this,*(char **)(this + 0x2000));
  if (!bVar1) {
    __assert_fail("pointer_in_buffer(m_ptr) && \"short_alloc has outlived arena\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxMemory.h"
                  ,0x51,
                  "char *Jinx::StaticArena<8192>::allocate(std::size_t) [N = 8192, alignment = 16, ReqAlign = 4UL]"
                 );
  }
  pSVar2 = (StaticArena<8192ul,16ul> *)StaticArena<8192UL,_16UL>::align_up(n);
  if (this + (0x2000 - *(long *)(this + 0x2000)) < pSVar2) {
    this_local = (StaticArena<8192UL,_16UL> *)MemAllocate(n);
  }
  else {
    this_local = *(StaticArena<8192UL,_16UL> **)(this + 0x2000);
    *(StaticArena<8192ul,16ul> **)(this + 0x2000) = pSVar2 + *(long *)(this + 0x2000);
  }
  return this_local->m_buffer;
}

Assistant:

char * StaticArena<N, alignment>::allocate(std::size_t n)
	{
		static_assert(ReqAlign <= alignment, "alignment is too small for this arena");
		assert(pointer_in_buffer(m_ptr) && "short_alloc has outlived arena");
		auto const aligned_n = align_up(n);
		if (static_cast<decltype(aligned_n)>(m_buffer + N - m_ptr) >= aligned_n)
		{
			char * r = m_ptr;
			m_ptr += aligned_n;
			return r;
		}

		static_assert(alignment <= alignof(std::max_align_t), "you've chosen an "
			"alignment that is larger than alignof(std::max_align_t), and "
			"cannot be guaranteed by normal operator new");
		return static_cast<char *>(Jinx::MemAllocate(n));
	}